

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void dump_fnbody(LispPTR fnblockaddr)

{
  void *NAddr;
  ushort uVar1;
  LispPTR LVar2;
  uint uVar3;
  fnhead *fnobj;
  int iVar4;
  ulong uVar5;
  DLbyte *addr;
  
  fnobj = (fnhead *)NativeAligned4FromLAddr(fnblockaddr);
  printf("***DUMP Func Obj << ");
  LVar2 = LAddrFromNative(fnobj);
  printf("start at 0x%x lisp address(%p 68k)\n",(ulong)LVar2,fnobj);
  print(*(uint *)&fnobj->field_0x8 & 0xfffffff);
  putchar(10);
  printf("stkmin    : %d\n",(ulong)fnobj->stkmin);
  printf("na        : %d\n",(ulong)(uint)(int)fnobj->na);
  printf("pv        : %d\n",(ulong)(uint)(int)fnobj->pv);
  printf("startpc   : %d\n",(ulong)fnobj->startpc);
  printf("argtype   : %d\n",(ulong)(*(uint *)&fnobj->field_0x8 >> 0x1c & 3));
  printf("framename : %d\n",(ulong)(*(uint *)&fnobj->field_0x8 & 0xfffffff));
  printf("ntsize    : %d\n",(ulong)fnobj->ntsize);
  printf("nlocals   : %d\n",(ulong)(byte)fnobj->field_0xd);
  printf("fvaroffset: %d\n",(ulong)(byte)fnobj->field_0xc);
  for (uVar5 = 0x14; uVar5 < fnobj->startpc; uVar5 = uVar5 + 2) {
    NAddr = (void *)((long)&fnobj->na + uVar5);
    uVar1 = *(ushort *)((ulong)NAddr ^ 2);
    LVar2 = LAddrFromNative(NAddr);
    printf(" 0x%x(%p 68k): 0%6o  0x%4x\n",(ulong)LVar2,NAddr,(ulong)(uint)uVar1,(ulong)(uint)uVar1);
  }
  addr = (DLbyte *)((long)&fnobj->na + (ulong)fnobj->startpc);
  iVar4 = 0;
  while( true ) {
    if (1999 < iVar4) {
      return;
    }
    uVar3 = print_opcode((uint)fnobj->startpc + iVar4,addr,fnobj);
    if ((int)uVar3 < 1) break;
    addr = addr + uVar3;
    iVar4 = iVar4 + uVar3;
  }
  return;
}

Assistant:

void dump_fnbody(LispPTR fnblockaddr)
/* atom index */
{
  struct fnhead *fnobj;
  DLbyte *scratch;
  int i;

  fnobj = (struct fnhead *)NativeAligned4FromLAddr(fnblockaddr);

  printf("***DUMP Func Obj << ");
  printf("start at 0x%x lisp address(%p 68k)\n", LAddrFromNative(fnobj), (void *)fnobj);

  print(fnobj->framename);
  putchar('\n');

  printf("stkmin    : %d\n", fnobj->stkmin);
  printf("na        : %d\n", fnobj->na);
  printf("pv        : %d\n", fnobj->pv);
  printf("startpc   : %d\n", fnobj->startpc);
  printf("argtype   : %d\n", fnobj->argtype);
  printf("framename : %d\n", fnobj->framename);
  printf("ntsize    : %d\n", fnobj->ntsize);
  printf("nlocals   : %d\n", fnobj->nlocals);
  printf("fvaroffset: %d\n", fnobj->fvaroffset);

  scratch = (DLbyte *)fnobj;
  for (i = 20; i < (fnobj->startpc); i += 2) {
    int word;
    word = (int)(0xffff & (GETWORD((DLword *)(scratch + i))));
    printf(" 0x%x(%p 68k): 0%6o  0x%4x\n", LAddrFromNative(scratch + i), (void *)(scratch + i), word, word);
  }

  scratch = (DLbyte *)fnobj + (fnobj->startpc);
  for (i = 0; i < 2000; i++) {
    int len = print_opcode(fnobj->startpc + i, scratch, fnobj);
    if (len < 1) return;
    scratch += len;
    i += (len - 1);
  }

}